

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      bVar1 = FieldDescriptor::is_map((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar2));
      if (bVar1) {
        return true;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(descriptor + 0x2c));
  }
  if (*(int *)(descriptor + 0x48) < 1) {
    bVar1 = false;
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    do {
      bVar1 = HasMapFields((Descriptor *)(*(long *)(descriptor + 0x50) + lVar2));
      if (bVar1) {
        return bVar1;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(descriptor + 0x48));
  }
  return bVar1;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}